

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  basic_format_specs<char> *pbVar5;
  long lVar6;
  char cVar7;
  uint uVar8;
  buffer_appender<char> bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  buffer<char> *buf;
  uint uVar13;
  _Alloc_hider _Var14;
  char *pcVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  bool bVar20;
  string groups;
  char digits [40];
  string local_2a8;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *local_288;
  char *local_280;
  char acStack_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_2a8,(locale_ref)(this->locale).locale_);
  if (local_2a8._M_string_length == 0) {
    on_dec(this);
    goto LAB_00119f05;
  }
  cVar7 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (cVar7 == '\0') {
    on_dec(this);
    goto LAB_00119f05;
  }
  uVar10 = this->abs_value;
  lVar17 = 0x3f;
  if ((uVar10 | 1) != 0) {
    for (; (uVar10 | 1) >> lVar17 == 0; lVar17 = lVar17 + -1) {
    }
  }
  uVar4 = *(ushort *)(&DAT_0011f6b0 + (uint)((int)lVar17 * 2));
  uVar18 = (uint)uVar4 -
           (uint)(uVar10 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar4 * 8))
  ;
  iVar19 = -(uint)(uVar10 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar4 * 8)
                  );
  bVar20 = local_2a8._M_string_length == 0;
  uVar8 = uVar18;
  uVar13 = uVar18;
  if (bVar20) {
LAB_00119cb5:
    uVar13 = uVar13 + (int)(uVar8 - 1) /
                      (int)local_2a8._M_dataplus._M_p[local_2a8._M_string_length - 1];
  }
  else {
    iVar16 = (int)*local_2a8._M_dataplus._M_p;
    if (0x81 < (byte)(*local_2a8._M_dataplus._M_p + 0x81U) && iVar16 < (int)uVar18) {
      uVar13 = (int)local_2a8._M_string_length + iVar19 + (uint)uVar4;
      lVar17 = 0;
      do {
        uVar8 = uVar8 - iVar16;
        bVar20 = local_2a8._M_string_length - 1 == lVar17;
        if (bVar20) goto LAB_00119cb5;
        lVar6 = lVar17 + 1;
        iVar16 = (int)local_2a8._M_dataplus._M_p[lVar6];
        lVar17 = lVar17 + 1;
      } while ((iVar16 < (int)uVar8) && (0x81 < (byte)(local_2a8._M_dataplus._M_p[lVar6] + 0x81U)));
      uVar13 = (int)lVar17 + uVar18;
    }
    if (bVar20) goto LAB_00119cb5;
  }
  pcVar15 = acStack_278 + (int)uVar18;
  uVar11 = uVar10;
  if (99 < uVar10) {
    do {
      uVar11 = uVar10 / 100;
      *(undefined2 *)(pcVar15 + -2) = *(undefined2 *)(basic_data<void>::digits + (uVar10 % 100) * 2)
      ;
      pcVar15 = pcVar15 + -2;
      bVar20 = 9999 < uVar10;
      uVar10 = uVar11;
    } while (bVar20);
  }
  if (uVar11 < 10) {
    pcVar15[-1] = (byte)uVar11 | 0x30;
  }
  else {
    *(undefined2 *)(pcVar15 + -2) = *(undefined2 *)(basic_data<void>::digits + uVar11 * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0012bc98;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar13 = uVar13 + this->prefix_size;
  if (-1 < (int)uVar13) {
    uVar10 = (ulong)uVar13;
    if (500 < uVar13) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar10);
    }
    local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
    if (uVar10 <= local_248.super_buffer<char>.capacity_) {
      local_248.super_buffer<char>.size_ = uVar10;
    }
    pcVar15 = local_248.super_buffer<char>.ptr_ + uVar10;
    if (0 < (int)uVar18) {
      uVar11 = (ulong)uVar18;
      iVar16 = iVar19 + (uint)uVar4 + 1;
      iVar19 = 0;
      _Var14._M_p = local_2a8._M_dataplus._M_p;
      do {
        uVar11 = uVar11 - 1;
        pcVar1 = pcVar15 + -1;
        pcVar15[-1] = acStack_278[uVar11 & 0xffffffff];
        cVar2 = *_Var14._M_p;
        if (0 < cVar2) {
          iVar19 = iVar19 + 1;
          if ((cVar2 != '\x7f') && (iVar19 % (int)cVar2 == 0)) {
            if (_Var14._M_p + 1 != local_2a8._M_dataplus._M_p + local_2a8._M_string_length) {
              iVar19 = 0;
              _Var14._M_p = _Var14._M_p + 1;
            }
            pcVar15[-2] = cVar7;
            pcVar1 = pcVar15 + -2;
          }
        }
        pcVar15 = pcVar1;
        iVar16 = iVar16 + -1;
      } while (1 < iVar16);
    }
    if (this->prefix_size != 0) {
      pcVar15[-1] = 0x2d;
    }
    pbVar5 = this->specs;
    uVar11 = (ulong)pbVar5->width;
    if (-1 < (long)uVar11) {
      local_280 = local_248.super_buffer<char>.ptr_;
      uVar12 = 0;
      if (uVar10 <= uVar11) {
        uVar12 = uVar11 - uVar10;
      }
      bVar9.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)pbVar5->field_0x9 & 0xf));
      local_288 = this;
      if (*(ulong *)((long)bVar9.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                           container + 0x18) <
          *(long *)((long)bVar9.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                   + 0x10) + uVar10 + (pbVar5->fill).size_ * uVar12) {
        (*(code *)**(undefined8 **)
                    bVar9.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (bVar9.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      uVar11 = uVar12 >> (bVar3 & 0x3f);
      bVar9 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar9,uVar11,&pbVar5->fill);
      bVar9 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                        (local_280,local_280 + uVar10,bVar9);
      bVar9 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar9,uVar12 - uVar11,&pbVar5->fill)
      ;
      (local_288->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar9.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0012bc98;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
      }
LAB_00119f05:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/3rdparty/fmt/include/fmt/core.h"
              ,0x13d,"negative value");
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += prefix_size;
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size;
    for (int i = num_digits - 1; i >= 0; --i) {
      *--p = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      p -= s.size();
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
    }
    if (prefix_size != 0) p[-1] = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }